

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O1

uint RigidBodyDynamics::GetMovableBodyId(Model *model,uint id)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (ulong)(id - model->fixed_body_discriminator);
  if ((id != 0xffffffff && model->fixed_body_discriminator <= id) &&
     (uVar2 = ((long)(model->mFixedBodies).
                     super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                     .
                     super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(model->mFixedBodies).
                     super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                     .
                     super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x79435e50d79435e5,
     uVar1 <= uVar2 && uVar2 - uVar1 != 0)) {
    id = (model->mFixedBodies).
         super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
         .
         super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar1].mMovableParent;
  }
  return id;
}

Assistant:

unsigned int GetMovableBodyId (Model& model, unsigned int id)
{
  if(model.IsFixedBodyId(id)) {
    unsigned int fbody_id = id - model.fixed_body_discriminator;
    return model.mFixedBodies[fbody_id].mMovableParent;
  } else {
    return id;
  }
}